

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O3

int Fraig_FeedBackCompress(Fraig_Man_t *p)

{
  Fraig_HashTable_t *pFVar1;
  Msat_IntVec_t *p_00;
  Fraig_Node_t **ppFVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Fraig_NodeVec_t *pFVar7;
  Fraig_Node_t *pFVar8;
  Fraig_NodeVec_t *pFVar9;
  void *__ptr;
  int *piVar10;
  Fraig_MemFixed_t *p_01;
  uint *puVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  Fraig_Node_t *pFVar18;
  int i;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  uint *puVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  
  iVar6 = p->nBTLimit;
  if ((iVar6 == -1) && (Fraig_FeedBackCheckTable(p), p->fDoSparse != 0)) {
    Fraig_FeedBackCheckTableF0(p);
  }
  pFVar1 = p->pTableF;
  p_00 = p->vPatsReal;
  pFVar7 = Fraig_NodeVecAlloc(100);
  iVar4 = pFVar1->nBins;
  if (0 < iVar4) {
    lVar12 = 0;
    do {
      pFVar18 = pFVar1->pBins[lVar12];
      if (pFVar18 != (Fraig_Node_t *)0x0) {
        pFVar9 = p->vCones;
        do {
          pFVar9->nSize = 0;
          pFVar8 = pFVar18;
          do {
            Fraig_NodeVecPush(p->vCones,pFVar8);
            pFVar8 = pFVar8->pNextD;
          } while (pFVar8 != (Fraig_Node_t *)0x0);
          pFVar9 = p->vCones;
          iVar4 = pFVar9->nSize;
          if (iVar4 - 2U < 0x13) {
            lVar26 = 1;
            lVar25 = 0;
            do {
              lVar24 = lVar25 + 1;
              lVar13 = (long)iVar4;
              lVar22 = lVar26;
              if (lVar24 < lVar13) {
                do {
                  iVar4 = Fraig_CompareSimInfoUnderMask
                                    (pFVar9->pArray[lVar25],pFVar9->pArray[lVar22],p->iWordStart,0,
                                     p->pSimsReal);
                  if (iVar4 != 0) {
                    pFVar8 = (Fraig_Node_t *)Fraig_MemFixedEntryFetch(p->mmSims);
                    if (0 < p->iWordStart) {
                      ppFVar2 = p->vCones->pArray;
                      puVar11 = ppFVar2[lVar25]->puSimD;
                      puVar23 = ppFVar2[lVar22]->puSimD;
                      puVar3 = p->pSimsReal;
                      lVar13 = 0;
                      do {
                        (&pFVar8->Num)[lVar13] =
                             ~puVar3[lVar13] & (puVar23[lVar13] ^ puVar11[lVar13]);
                        lVar13 = lVar13 + 1;
                      } while (lVar13 < p->iWordStart);
                    }
                    Fraig_NodeVecPush(pFVar7,pFVar8);
                  }
                  lVar22 = lVar22 + 1;
                  pFVar9 = p->vCones;
                  iVar4 = pFVar9->nSize;
                } while ((int)lVar22 < iVar4);
                lVar13 = (long)iVar4;
              }
              lVar26 = lVar26 + 1;
              lVar25 = lVar24;
            } while (lVar24 < lVar13);
          }
          pFVar18 = pFVar18->pNextF;
        } while (pFVar18 != (Fraig_Node_t *)0x0);
        iVar4 = pFVar1->nBins;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar4);
  }
  if (p->fDoSparse != 0) {
    pFVar1 = p->pTableF0;
    iVar4 = pFVar1->nBins;
    if (0 < (long)iVar4) {
      ppFVar2 = pFVar1->pBins;
      lVar12 = 0;
      do {
        pFVar18 = ppFVar2[lVar12];
        if (pFVar18 != (Fraig_Node_t *)0x0) {
          uVar5 = p->iWordStart;
          do {
            pFVar18->uHashD = 0;
            if (0 < (int)uVar5) {
              puVar11 = p->pSimsReal;
              uVar21 = 0;
              uVar14 = 0;
              do {
                uVar14 = uVar14 ^ (puVar11[uVar21] & pFVar18->puSimD[uVar21]) *
                                  s_FraigPrimes[uVar21];
                pFVar18->uHashD = uVar14;
                uVar21 = uVar21 + 1;
              } while (uVar5 != uVar21);
            }
            pFVar18 = pFVar18->pNextF;
          } while (pFVar18 != (Fraig_Node_t *)0x0);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != iVar4);
    }
    Fraig_TableRehashF0(p,1);
    iVar4 = pFVar1->nBins;
    if (0 < iVar4) {
      lVar12 = 0;
      do {
        pFVar18 = pFVar1->pBins[lVar12];
        if (pFVar18 != (Fraig_Node_t *)0x0) {
          pFVar9 = p->vCones;
          do {
            pFVar9->nSize = 0;
            pFVar8 = pFVar18;
            do {
              Fraig_NodeVecPush(p->vCones,pFVar8);
              pFVar8 = pFVar8->pNextD;
            } while (pFVar8 != (Fraig_Node_t *)0x0);
            pFVar9 = p->vCones;
            iVar4 = pFVar9->nSize;
            if (1 < iVar4) {
              lVar26 = 1;
              lVar25 = 0;
              do {
                lVar24 = lVar25 + 1;
                lVar13 = (long)iVar4;
                lVar22 = lVar26;
                if (lVar24 < lVar13) {
                  do {
                    pFVar8 = (Fraig_Node_t *)Fraig_MemFixedEntryFetch(p->mmSims);
                    if (0 < p->iWordStart) {
                      ppFVar2 = p->vCones->pArray;
                      puVar11 = ppFVar2[lVar25]->puSimD;
                      puVar23 = ppFVar2[lVar22]->puSimD;
                      puVar3 = p->pSimsReal;
                      lVar13 = 0;
                      do {
                        (&pFVar8->Num)[lVar13] =
                             ~puVar3[lVar13] & (puVar23[lVar13] ^ puVar11[lVar13]);
                        lVar13 = lVar13 + 1;
                      } while (lVar13 < p->iWordStart);
                    }
                    Fraig_NodeVecPush(pFVar7,pFVar8);
                    lVar22 = lVar22 + 1;
                    pFVar9 = p->vCones;
                    iVar4 = pFVar9->nSize;
                  } while ((int)lVar22 < iVar4);
                  lVar13 = (long)iVar4;
                }
                lVar26 = lVar26 + 1;
                lVar25 = lVar24;
              } while (lVar24 < lVar13);
            }
            pFVar18 = pFVar18->pNextF;
          } while (pFVar18 != (Fraig_Node_t *)0x0);
          iVar4 = pFVar1->nBins;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < iVar4);
    }
  }
  iVar4 = pFVar7->nSize;
  __ptr = malloc((long)iVar4 * 4);
  if (0 < (long)iVar4) {
    lVar12 = 0;
    do {
      iVar4 = Fraig_BitStringCountOnes((uint *)pFVar7->pArray[lVar12],p->iWordStart);
      *(int *)((long)__ptr + lVar12 * 4) = iVar4;
      lVar12 = lVar12 + 1;
    } while (lVar12 < pFVar7->nSize);
  }
  Msat_IntVecReadSize(p_00);
  do {
    uVar5 = pFVar7->nSize;
    if ((int)uVar5 < 1) goto LAB_0090acc5;
    uVar17 = 0xffffffff;
    iVar4 = 1000000;
    uVar21 = 0;
    do {
      iVar15 = *(int *)((long)__ptr + uVar21 * 4);
      if (iVar15 != 0) {
        if (iVar15 == 1) {
          iVar15 = (int)uVar21;
          break;
        }
        if (iVar15 < iVar4) {
          uVar17 = uVar21 & 0xffffffff;
        }
        if (iVar15 <= iVar4) {
          iVar4 = iVar15;
        }
      }
      iVar15 = (int)uVar17;
      uVar21 = uVar21 + 1;
    } while (uVar5 != uVar21);
    if (iVar15 == -1) {
      lVar12 = 0;
      do {
        Fraig_MemFixedEntryRecycle(p->mmSims,(char *)pFVar7->pArray[lVar12]);
        lVar12 = lVar12 + 1;
      } while (lVar12 < pFVar7->nSize);
LAB_0090acc5:
      Fraig_NodeVecFree(pFVar7);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      uVar5 = Msat_IntVecReadSize(p->vPatsReal);
      piVar10 = Msat_IntVecReadArray(p->vPatsReal);
      uVar20 = p->iPatsPerm + uVar5;
      iVar4 = (int)uVar20 >> 5;
      uVar19 = uVar20 & 0x1f;
      uVar14 = (uint)(uVar19 != 0) + iVar4;
      uVar21 = (ulong)uVar14;
      p->iWordStart = uVar14;
      pFVar7 = p->vInputs;
      if (0 < pFVar7->nSize) {
        ppFVar2 = pFVar7->pArray;
        lVar12 = 0;
        do {
          pFVar18 = ppFVar2[lVar12];
          puVar11 = pFVar18->puSimD;
          lVar25 = (long)p->iWordPerm;
          if (p->iWordPerm < (int)uVar21) {
            puVar23 = p->pSimsTemp;
            do {
              puVar23[lVar25] = 0;
              lVar25 = lVar25 + 1;
              uVar21 = (ulong)p->iWordStart;
            } while (lVar25 < (long)uVar21);
          }
          if (0 < (int)uVar5) {
            uVar21 = 0;
            do {
              if ((puVar11[piVar10[uVar21] >> 5] >> (piVar10[uVar21] & 0x1fU) & 1) != 0) {
                lVar25 = (uint)p->iPatsPerm + uVar21;
                iVar4 = (int)lVar25;
                puVar23 = puVar11;
                if (p->iWordPerm * 0x20 <= iVar4) {
                  puVar23 = p->pSimsTemp;
                }
                puVar23[iVar4 >> 5] = puVar23[iVar4 >> 5] | 1 << ((byte)lVar25 & 0x1f);
              }
              uVar21 = uVar21 + 1;
            } while (uVar5 != uVar21);
            uVar21 = (ulong)(uint)p->iWordStart;
          }
          lVar25 = (long)p->iWordPerm;
          if (p->iWordPerm < (int)uVar21) {
            puVar23 = p->pSimsTemp;
            do {
              puVar11[lVar25] = puVar23[lVar25];
              lVar25 = lVar25 + 1;
              uVar21 = (ulong)p->iWordStart;
            } while (lVar25 < (long)uVar21);
          }
          uVar14 = (uint)uVar21;
          if ((int)uVar14 < 1) {
            uVar20 = 0;
          }
          else {
            uVar17 = 0;
            uVar20 = 0;
            do {
              uVar20 = uVar20 ^ s_FraigPrimes[uVar17] * puVar11[uVar17];
              uVar17 = uVar17 + 1;
            } while ((uVar21 & 0xffffffff) != uVar17);
          }
          pFVar18->uHashD = uVar20;
          lVar12 = lVar12 + 1;
        } while (lVar12 < pFVar7->nSize);
        uVar20 = p->iPatsPerm + uVar5;
        iVar4 = (int)uVar20 >> 5;
        uVar19 = uVar20 & 0x1f;
      }
      p->iWordPerm = uVar14;
      p->iPatsPerm = uVar20;
      if (uVar14 != (iVar4 + 1) - (uint)(uVar19 == 0)) {
        __assert_fail("p->iWordPerm == FRAIG_NUM_WORDS( p->iPatsPerm )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigFeed.c"
                      ,0x14e,"int Fraig_FeedBackCompress(Fraig_Man_t *)");
      }
      pFVar7 = p->vNodes;
      if (1 < pFVar7->nSize) {
        lVar12 = 1;
        do {
          iVar4 = Fraig_NodeIsAnd(pFVar7->pArray[lVar12]);
          if (iVar4 != 0) {
            pFVar18 = p->vNodes->pArray[lVar12];
            pFVar18->uHashD = 0;
            Fraig_NodeSimulate(pFVar18,0,p->iWordPerm,0);
          }
          lVar12 = lVar12 + 1;
          pFVar7 = p->vNodes;
        } while (lVar12 < pFVar7->nSize);
      }
      if (iVar6 == -1) {
        Fraig_FeedBackCheckTable(p);
        if (p->fDoSparse != 0) {
          Fraig_TableRehashF0(p,0);
          Fraig_FeedBackCheckTableF0(p);
        }
      }
      else if (p->fDoSparse != 0) {
        Fraig_TableRehashF0(p,0);
      }
      if (p->nWordsDyna < p->iWordPerm + 5) {
        iVar6 = p->nWordsDyna * 2;
        p->nWordsDyna = iVar6;
        p_01 = Fraig_MemFixedStart((iVar6 + p->nWordsRand) * 4);
        pFVar18 = p->pConst1;
        puVar11 = (uint *)Fraig_MemFixedEntryFetch(p_01);
        pFVar18->puSimR = puVar11;
        iVar6 = p->nWordsRand;
        pFVar18->puSimD = puVar11 + iVar6;
        memset(puVar11,0,(long)iVar6 << 2);
        memset(pFVar18->puSimD,0,(long)p->nWordsDyna << 2);
        pFVar7 = p->vInputs;
        if (0 < pFVar7->nSize) {
          lVar12 = 0;
          do {
            pFVar18 = pFVar7->pArray[lVar12];
            puVar11 = (uint *)Fraig_MemFixedEntryFetch(p_01);
            memmove(puVar11,pFVar18->puSimR,((long)p->iWordStart + (long)p->nWordsRand) * 4);
            pFVar18->puSimR = puVar11;
            pFVar18->puSimD = puVar11 + p->nWordsRand;
            lVar12 = lVar12 + 1;
            pFVar7 = p->vInputs;
          } while (lVar12 < pFVar7->nSize);
        }
        Fraig_MemFixedStop(p->mmSims,0);
        p->mmSims = p_01;
        pFVar7 = p->vNodes;
        if (1 < pFVar7->nSize) {
          lVar12 = 1;
          do {
            pFVar18 = pFVar7->pArray[lVar12];
            iVar6 = Fraig_NodeIsAnd(pFVar18);
            if (iVar6 != 0) {
              puVar11 = (uint *)Fraig_MemFixedEntryFetch(p_01);
              pFVar18->puSimR = puVar11;
              iVar6 = p->nWordsRand;
              pFVar18->puSimD = puVar11 + iVar6;
              uVar5 = pFVar18->uHashR;
              pFVar18->uHashR = 0;
              Fraig_NodeSimulate(pFVar18,0,iVar6,1);
              if (uVar5 != pFVar18->uHashR) {
                __assert_fail("uSignOld == pNode->uHashR",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigFeed.c"
                              ,0x2f8,"void Fraig_ReallocateSimulationInfo(Fraig_Man_t *)");
              }
              uVar5 = pFVar18->uHashD;
              pFVar18->uHashD = 0;
              Fraig_NodeSimulate(pFVar18,0,p->iWordStart,0);
              if (uVar5 != pFVar18->uHashD) {
                __assert_fail("uSignOld == pNode->uHashD",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigFeed.c"
                              ,0x2fd,"void Fraig_ReallocateSimulationInfo(Fraig_Man_t *)");
              }
            }
            lVar12 = lVar12 + 1;
            pFVar7 = p->vNodes;
          } while (lVar12 < pFVar7->nSize);
        }
        puVar11 = (uint *)Fraig_MemFixedEntryFetch(p_01);
        p->pSimsReal = puVar11;
        memset(puVar11,0,(long)p->nWordsDyna << 2);
        puVar11 = (uint *)Fraig_MemFixedEntryFetch(p_01);
        p->pSimsTemp = puVar11;
        puVar11 = (uint *)Fraig_MemFixedEntryFetch(p_01);
        p->pSimsDiff = puVar11;
      }
      Msat_IntVecClear(p->vPatsReal);
      memset(p->pSimsReal,0,(long)p->nWordsDyna << 2);
      iVar6 = p->iWordPerm;
      if (0 < iVar6) {
        puVar11 = p->pSimsReal;
        lVar12 = 0;
        do {
          puVar11[lVar12] = 0xffffffff;
          lVar12 = lVar12 + 1;
          iVar6 = p->iWordPerm;
        } while (lVar12 < iVar6);
      }
      iVar4 = p->iPatsPerm % 0x20;
      if (0 < iVar4) {
        p->pSimsReal[(long)iVar6 + -1] = 0xffffffff >> (-(char)iVar4 & 0x1fU);
      }
      return p->iWordStart;
    }
    ppFVar2 = pFVar7->pArray;
    iVar4 = -1;
    if (0 < (long)p->iWordStart) {
      iVar16 = 0;
      lVar12 = 0;
      do {
        uVar14 = (&ppFVar2[iVar15]->Num)[lVar12];
        if (uVar14 != 0) {
          uVar20 = 0;
          do {
            if ((uVar14 >> (uVar20 & 0x1f) & 1) != 0) {
              iVar4 = uVar20 - iVar16;
              goto LAB_0090ac65;
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 != 0x20);
        }
        lVar12 = lVar12 + 1;
        iVar16 = iVar16 + -0x20;
      } while (lVar12 != p->iWordStart);
    }
LAB_0090ac65:
    uVar21 = 0;
    do {
      if (((&ppFVar2[uVar21]->Num)[iVar4 >> 5] & 1 << ((byte)iVar4 & 0x1f)) != 0) {
        *(undefined4 *)((long)__ptr + uVar21 * 4) = 0;
      }
      uVar21 = uVar21 + 1;
    } while (uVar5 != uVar21);
    Msat_IntVecPush(p_00,iVar4);
  } while( true );
}

Assistant:

int Fraig_FeedBackCompress( Fraig_Man_t * p )
{
    unsigned * pSims;
    unsigned uHash;
    int i, w, t, nPats, * pPats;
    int fPerformChecks = (p->nBTLimit == -1);

    // solve the covering problem
    if ( fPerformChecks )
    {
        Fraig_FeedBackCheckTable( p );
        if ( p->fDoSparse ) 
            Fraig_FeedBackCheckTableF0( p );
    }

    // solve the covering problem
    Fraig_FeedBackCovering( p, p->vPatsReal );


    // get the number of additional patterns
    nPats = Msat_IntVecReadSize( p->vPatsReal );
    pPats = Msat_IntVecReadArray( p->vPatsReal );
    // get the new starting word
    p->iWordStart = FRAIG_NUM_WORDS( p->iPatsPerm + nPats );

    // set the simulation info for the PIs
    for ( i = 0; i < p->vInputs->nSize; i++ )
    {
        // get hold of the simulation info for this PI
        pSims = p->vInputs->pArray[i]->puSimD;
        // clean the storage for the new patterns
        for ( w = p->iWordPerm; w < p->iWordStart; w++ )
            p->pSimsTemp[w] = 0;
        // set the patterns
        for ( t = 0; t < nPats; t++ )
            if ( Fraig_BitStringHasBit( pSims, pPats[t] ) )
            {
                // check if this pattern falls into temporary storage
                if ( p->iPatsPerm + t < p->iWordPerm * 32 )
                    Fraig_BitStringSetBit( pSims, p->iPatsPerm + t );
                else
                    Fraig_BitStringSetBit( p->pSimsTemp, p->iPatsPerm + t );
            }
        // copy the pattern 
        for ( w = p->iWordPerm; w < p->iWordStart; w++ )
            pSims[w] = p->pSimsTemp[w];
        // recompute the hashing info
        uHash = 0;
        for ( w = 0; w < p->iWordStart; w++ )
            uHash ^= pSims[w] * s_FraigPrimes[w];
        p->vInputs->pArray[i]->uHashD = uHash;
    }

    // update info about the permanently stored patterns
    p->iWordPerm = p->iWordStart;
    p->iPatsPerm += nPats;
    assert( p->iWordPerm == FRAIG_NUM_WORDS( p->iPatsPerm ) );

    // resimulate and recompute the hash values
    for ( i = 1; i < p->vNodes->nSize; i++ )
        if ( Fraig_NodeIsAnd(p->vNodes->pArray[i]) )
        {
            p->vNodes->pArray[i]->uHashD = 0;
            Fraig_NodeSimulate( p->vNodes->pArray[i], 0, p->iWordPerm, 0 );
        }

    // double-check that the nodes are still distinguished
    if ( fPerformChecks )
        Fraig_FeedBackCheckTable( p );

    // rehash the values in the F0 table
    if ( p->fDoSparse ) 
    {
        Fraig_TableRehashF0( p, 0 );
        if ( fPerformChecks )
            Fraig_FeedBackCheckTableF0( p );
    }

    // check if we need to resize the simulation info
    // if less than FRAIG_WORDS_STORE words are left, reallocate simulation info
    if ( p->iWordPerm + FRAIG_WORDS_STORE > p->nWordsDyna )
        Fraig_ReallocateSimulationInfo( p );

    // set the real patterns
    Msat_IntVecClear( p->vPatsReal );
    memset( p->pSimsReal, 0, sizeof(unsigned)*p->nWordsDyna );
    for ( w = 0; w < p->iWordPerm; w++ )
        p->pSimsReal[w] = FRAIG_FULL;
    if ( p->iPatsPerm % 32 > 0 )
        p->pSimsReal[p->iWordPerm-1] = FRAIG_MASK( p->iPatsPerm % 32 );
//    printf( "The number of permanent words = %d.\n", p->iWordPerm );
    return p->iWordStart;
}